

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::testDepthStencilSupported
          (TestStatus *__return_storage_ptr__,Context *context)

{
  bool bVar1;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Context *local_18;
  Context *context_local;
  
  local_18 = context;
  context_local = (Context *)__return_storage_ptr__;
  bVar1 = optimalTilingFeaturesSupported(context,VK_FORMAT_X8_D24_UNORM_PACK32,0x200);
  if ((!bVar1) &&
     (bVar1 = optimalTilingFeaturesSupported(local_18,VK_FORMAT_D32_SFLOAT,0x200), !bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "Doesn\'t support one of VK_FORMAT_X8_D24_UNORM_PACK32 or VK_FORMAT_D32_SFLOAT",
               &local_39);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    return __return_storage_ptr__;
  }
  bVar1 = optimalTilingFeaturesSupported(local_18,VK_FORMAT_D24_UNORM_S8_UINT,0x200);
  if ((!bVar1) &&
     (bVar1 = optimalTilingFeaturesSupported(local_18,VK_FORMAT_D32_SFLOAT_S8_UINT,0x200), !bVar1))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "Doesn\'t support one of VK_FORMAT_D24_UNORM_S8_UINT or VK_FORMAT_D32_SFLOAT_S8_UINT"
               ,&local_71);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Required depth/stencil formats supported",&local_99);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testDepthStencilSupported (Context& context)
{
	if (!optimalTilingFeaturesSupported(context, VK_FORMAT_X8_D24_UNORM_PACK32, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT) &&
		!optimalTilingFeaturesSupported(context, VK_FORMAT_D32_SFLOAT, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
		return tcu::TestStatus::fail("Doesn't support one of VK_FORMAT_X8_D24_UNORM_PACK32 or VK_FORMAT_D32_SFLOAT");

	if (!optimalTilingFeaturesSupported(context, VK_FORMAT_D24_UNORM_S8_UINT, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT) &&
		!optimalTilingFeaturesSupported(context, VK_FORMAT_D32_SFLOAT_S8_UINT, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
		return tcu::TestStatus::fail("Doesn't support one of VK_FORMAT_D24_UNORM_S8_UINT or VK_FORMAT_D32_SFLOAT_S8_UINT");

	return tcu::TestStatus::pass("Required depth/stencil formats supported");
}